

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sssort.c
# Opt level: O2

void ss_fixdown(sauchar_t *Td,saidx64_t *PA,saidx64_t *SA,saidx64_t i,saidx64_t size)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  long lVar4;
  long lVar5;
  byte bVar6;
  
  lVar4 = SA[i];
  bVar1 = Td[PA[lVar4]];
  while (lVar5 = i * 2 + 1, lVar5 < size) {
    bVar2 = Td[PA[SA[lVar5]]];
    bVar3 = Td[PA[SA[i * 2 + 2]]];
    bVar6 = bVar3;
    if (bVar3 < bVar2) {
      bVar6 = bVar2;
    }
    if (bVar6 <= bVar1) break;
    if (bVar2 < bVar3) {
      lVar5 = i * 2 + 2;
    }
    SA[i] = SA[lVar5];
    i = lVar5;
  }
  SA[i] = lVar4;
  return;
}

Assistant:

static INLINE
void
ss_fixdown(const sauchar_t *Td, const saidx_t *PA,
           saidx_t *SA, saidx_t i, saidx_t size) {
  saidx_t j, k;
  saidx_t v;
  saint_t c, d, e;

  for(v = SA[i], c = Td[PA[v]]; (j = 2 * i + 1) < size; SA[i] = SA[k], i = k) {
    d = Td[PA[SA[k = j++]]];
    if(d < (e = Td[PA[SA[j]]])) { k = j; d = e; }
    if(d <= c) { break; }
  }
  SA[i] = v;
}